

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileUtilsSystemSpecific.cpp
# Opt level: O0

void ApprovalTests::FileUtilsSystemSpecific::copyFile(string *source,string *destination)

{
  string cmd;
  bool in_stack_0000012f;
  string *in_stack_00000130;
  string *in_stack_00000138;
  string local_30 [48];
  
  SystemUtils::isWindowsOs();
  getCommandLineForCopy(in_stack_00000138,in_stack_00000130,in_stack_0000012f);
  SystemUtils::runSystemCommandOrThrow((string *)cmd._M_string_length,(bool)cmd._7_1_);
  ::std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void FileUtilsSystemSpecific::copyFile(const std::string& source,
                                           const std::string& destination)
    {
        auto cmd = getCommandLineForCopy(source, destination, SystemUtils::isWindowsOs());
        SystemUtils::runSystemCommandOrThrow(cmd);
    }